

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StridedArrayView.h
# Opt level: O1

void __thiscall
Corrade::Containers::StridedArrayView<4U,_char>::StridedArrayView
          (StridedArrayView<4U,_char> *this,ArrayView<void> data,char *member,Size<4U> *size,
          Stride<4U> *stride)

{
  long lVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ArrayView<void> local_48;
  anon_class_24_3_a165bac9 local_38;
  
  local_48._size = data._size;
  local_48._data = data._data;
  local_38.data = &local_48;
  if (((size->_data[1] != 0 && size->_data[0] != 0) && (size->_data[2] != 0)) &&
     (size->_data[3] != 0)) {
    lVar1 = stride->_data[0];
    lVar6 = -lVar1;
    if (0 < lVar1) {
      lVar6 = lVar1;
    }
    lVar1 = stride->_data[1];
    uVar7 = lVar6 * size->_data[0];
    lVar6 = -lVar1;
    if (0 < lVar1) {
      lVar6 = lVar1;
    }
    uVar8 = lVar6 * size->_data[1];
    lVar1 = stride->_data[2];
    lVar6 = -lVar1;
    if (0 < lVar1) {
      lVar6 = lVar1;
    }
    uVar9 = lVar6 * size->_data[2];
    lVar1 = stride->_data[3];
    lVar6 = -lVar1;
    if (0 < lVar1) {
      lVar6 = lVar1;
    }
    uVar10 = lVar6 * size->_data[3];
    if (uVar10 <= uVar9 && uVar9 - uVar10 != 0) {
      uVar10 = uVar9;
    }
    if (uVar10 <= uVar8 && uVar8 - uVar10 != 0) {
      uVar10 = uVar8;
    }
    if (uVar10 <= uVar7 && uVar7 - uVar10 != 0) {
      uVar10 = uVar7;
    }
    if (local_48._size < uVar10) {
      local_38.size = size;
      local_38.stride = stride;
      StridedArrayView::anon_class_24_3_a165bac9::operator()(&local_38);
    }
  }
  this->_data = member;
  uVar2 = size->_data[1];
  uVar3 = size->_data[2];
  uVar4 = size->_data[3];
  (this->_size)._data[0] = size->_data[0];
  (this->_size)._data[1] = uVar2;
  (this->_size)._data[2] = uVar3;
  (this->_size)._data[3] = uVar4;
  lVar1 = stride->_data[1];
  lVar6 = stride->_data[2];
  lVar5 = stride->_data[3];
  (this->_stride)._data[0] = stride->_data[0];
  (this->_stride)._data[1] = lVar1;
  (this->_stride)._data[2] = lVar6;
  (this->_stride)._data[3] = lVar5;
  return;
}

Assistant:

constexpr StridedArrayView<dimensions, T>::StridedArrayView(ArrayView<ErasedType> data, T* member, const Containers::Size<dimensions>& size, const Containers::Stride<dimensions>& stride) noexcept: _data{(
    /* A strided array view is usually not created from scratch in tight loops
       (except for slicing, which uses a different constructor) and should be
       as checked as possible, so it's not a debug assert */
    /** @todo can't compare void pointers to check if member is in data, it's
        not constexpr :( */
    /* If any size is zero, data can be zero-sized too. If the largest stride
       is zero, `data` can have *any* size and it could be okay, can't reliably
       test that */
    CORRADE_CONSTEXPR_ASSERT(Implementation::isAnyDimensionZero(size._data, typename Implementation::GenerateSequence<dimensions>::Type{}) || Implementation::largestStride(size._data, stride._data, typename Implementation::GenerateSequence<dimensions>::Type{}) <= data.size(),
        "Containers::StridedArrayView: data size" << data.size() << "is not enough for" << size << "elements of stride" << stride),
    #ifdef CORRADE_NO_ASSERT
    static_cast<void>(data),
    #endif
    member)}, _size{size}, _stride{stride} {}